

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-test.c++
# Opt level: O2

void __thiscall kj::_::anon_unknown_0::TestCase71::run(TestCase71 *this)

{
  uint uVar1;
  StringPtr *pSVar2;
  uint uVar3;
  Exception *pEVar4;
  None *pNVar5;
  long lVar6;
  char (*params) [4];
  char (*pacVar7) [7];
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  char (*extraout_RDX_03) [7];
  char (*params_00) [6];
  ulong uVar8;
  ulong extraout_RDX_04;
  Fault FVar9;
  None *pNVar10;
  size_t count;
  char *pcVar11;
  HashBucket *pHVar12;
  StringPtr *row;
  char *pcVar13;
  HashBucket *_s944;
  uint uVar14;
  size_t sVar15;
  long lVar16;
  HashBucket *pHVar17;
  size_t i;
  size_t sVar18;
  char *pos_00;
  bool bVar19;
  ArrayPtr<kj::StringPtr> table_00;
  StringPtr str;
  StringPtr a;
  StringPtr str_00;
  StringPtr a_00;
  StringPtr b;
  StringPtr b_00;
  bool success;
  size_t pos;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> table;
  DebugExpression<bool> _kjCondition_31;
  undefined7 uStack_567;
  DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> _kjCondition;
  undefined8 local_528;
  undefined8 local_520;
  char searchWaldo [7];
  anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 aStack_398;
  char insertWaldo [7];
  Exception *local_200;
  StringPtr STRS [3];
  StringPtr local_40;
  
  table.rows.builder.ptr = (StringPtr *)0x0;
  table.rows.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
  table.rows.builder.endPtr = (StringPtr *)0x0;
  table.rows.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  table.indexes.erasedCount = 0;
  table.indexes.buckets.ptr = (HashBucket *)0x0;
  table.indexes.buckets.size_ = 0;
  table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             searchWaldo,(char (*) [7])&table);
  _kjCondition.left.ptr = (char (*) [7])_searchWaldo;
  _kjCondition.right = (None *)&none;
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  if (Debug::minSeverity < 3 && (Exception *)_searchWaldo != (Exception *)0x0) {
    _kjCondition.result = (Exception *)_searchWaldo == (Exception *)0x0;
    Debug::log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x4a,ERROR,
               "\"failed: expected \" \"table.find(\\\"foo\\\") == kj::none\", _kjCondition",
               (char (*) [47])"failed: expected table.find(\"foo\") == kj::none",&_kjCondition);
  }
  _kjCondition.right = (None *)((ulong)_kjCondition.right & 0xffffffff00000000);
  _kjCondition.left.ptr =
       (char (*) [7])((long)table.rows.builder.pos - (long)table.rows.builder.ptr >> 4);
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = table.rows.builder.pos == table.rows.builder.ptr;
  if ((table.rows.builder.pos != table.rows.builder.ptr) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x4c,ERROR,"\"failed: expected \" \"table.size() == 0\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 0",
               (DebugComparison<unsigned_long,_int>_conflict *)&_kjCondition);
  }
  _searchWaldo = "foo";
  _insertWaldo = (char *)Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                         ::insert(&table,(StringPtr *)searchWaldo);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)insertWaldo,(char (*) [7])0x1c1d05);
  if (Debug::minSeverity < 3 && _kjCondition.result == false) {
    Debug::log<char_const(&)[46],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x4d,ERROR,
               "\"failed: expected \" \"table.insert(\\\"foo\\\") == \\\"foo\\\"\", _kjCondition",
               (char (*) [46])"failed: expected table.insert(\"foo\") == \"foo\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition);
  }
  lVar6 = (long)table.rows.builder.pos - (long)table.rows.builder.ptr;
  _kjCondition.left.ptr = (char (*) [7])(lVar6 >> 4);
  _kjCondition.right = (None *)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = lVar6 == 0x10;
  if ((lVar6 != 0x10) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x4e,ERROR,"\"failed: expected \" \"table.size() == 1\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 1",
               (DebugComparison<unsigned_long,_int>_conflict *)&_kjCondition);
  }
  _searchWaldo = "bar";
  _insertWaldo = (char *)Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                         ::insert(&table,(StringPtr *)searchWaldo);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)insertWaldo,(char (*) [7])0x1b5691);
  if (Debug::minSeverity < 3 && _kjCondition.result == false) {
    Debug::log<char_const(&)[46],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x4f,ERROR,
               "\"failed: expected \" \"table.insert(\\\"bar\\\") == \\\"bar\\\"\", _kjCondition",
               (char (*) [46])"failed: expected table.insert(\"bar\") == \"bar\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition);
  }
  lVar6 = (long)table.rows.builder.pos - (long)table.rows.builder.ptr;
  _kjCondition.left.ptr = (char (*) [7])(lVar6 >> 4);
  _kjCondition.right = (None *)CONCAT44(_kjCondition.right._4_4_,2);
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = lVar6 == 0x20;
  if ((lVar6 != 0x20) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x50,ERROR,"\"failed: expected \" \"table.size() == 2\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 2",
               (DebugComparison<unsigned_long,_int>_conflict *)&_kjCondition);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             insertWaldo,(char (*) [7])&table);
  if ((Exception *)_insertWaldo == (Exception *)0x0) {
    Debug::Fault::Fault((Fault *)insertWaldo,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,(char  [7])0x52,FAILED,"table.find(\"foo\") != nullptr","");
    Debug::Fault::fatal((Fault *)insertWaldo);
  }
  _searchWaldo = _insertWaldo;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)searchWaldo,(char (*) [7])0x1c1d05);
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x52,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(table.find(\\\"foo\\\")) == \\\"foo\\\"\", _kjCondition"
               ,(char (*) [63])"failed: expected KJ_ASSERT_NONNULL(table.find(\"foo\")) == \"foo\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             insertWaldo,(char (*) [7])&table);
  if ((Exception *)_insertWaldo == (Exception *)0x0) {
    Debug::Fault::Fault((Fault *)insertWaldo,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,(char  [7])0x53,FAILED,"table.find(\"bar\") != nullptr","");
    Debug::Fault::fatal((Fault *)insertWaldo);
  }
  _searchWaldo = _insertWaldo;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)searchWaldo,(char (*) [7])0x1b5691);
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x53,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(table.find(\\\"bar\\\")) == \\\"bar\\\"\", _kjCondition"
               ,(char (*) [63])"failed: expected KJ_ASSERT_NONNULL(table.find(\"bar\")) == \"bar\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             searchWaldo,(char (*) [7])&table);
  _kjCondition.left.ptr = (char (*) [7])_searchWaldo;
  _kjCondition.right = (None *)&none;
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  bVar19 = (Exception *)_searchWaldo == (Exception *)0x0;
  _kjCondition.result = bVar19;
  if ((!bVar19) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x54,ERROR,
               "\"failed: expected \" \"table.find(\\\"fop\\\") == kj::none\", _kjCondition",
               (char (*) [47])"failed: expected table.find(\"fop\") == kj::none",&_kjCondition);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             searchWaldo,(char (*) [7])&table);
  _kjCondition.left.ptr = (char (*) [7])_searchWaldo;
  _kjCondition.right = (None *)&none;
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = (Exception *)_searchWaldo == (Exception *)0x0;
  if (((Exception *)_searchWaldo != (Exception *)0x0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x55,ERROR,
               "\"failed: expected \" \"table.find(\\\"baq\\\") == kj::none\", _kjCondition",
               (char (*) [47])"failed: expected table.find(\"baq\") == kj::none",&_kjCondition);
  }
  _kjCondition.left.ptr = (char (*) [7])0x1c55c2;
  _kjCondition.right = (None *)0x4;
  pEVar4 = (Exception *)
           Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::insert
                     (&table,(StringPtr *)&_kjCondition);
  _searchWaldo = (char *)pEVar4;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)searchWaldo,(char (*) [7])0x1c55c2);
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[30],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x59,ERROR,"\"failed: expected \" \"ref == \\\"baz\\\"\", _kjCondition",
               (char (*) [30])"failed: expected ref == \"baz\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             &_kjCondition,(char (*) [7])&table);
  if (_kjCondition.left.ptr == (char (*) [7])0x0) {
    Debug::Fault::Fault((Fault *)&_kjCondition,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,(char  [7])0x5a,FAILED,"table.find(\"baz\") != nullptr","");
    Debug::Fault::fatal((Fault *)&_kjCondition);
  }
  bVar19 = pEVar4 == (Exception *)_kjCondition.left.ptr;
  _kjCondition.right = (None *)_kjCondition.left.ptr;
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  if (Debug::minSeverity < 3 && !bVar19) {
    _kjCondition.left.ptr = (char (*) [7])pEVar4;
    _kjCondition.result = bVar19;
    Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x5b,ERROR,"\"failed: expected \" \"&ref == &ref2\", _kjCondition",
               (char (*) [31])"failed: expected &ref == &ref2",
               (DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)&_kjCondition);
  }
  lVar6 = (long)table.rows.builder.pos - (long)table.rows.builder.ptr;
  _kjCondition.left.ptr = (char (*) [7])(lVar6 >> 4);
  _kjCondition.right = (None *)CONCAT44(_kjCondition.right._4_4_,3);
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = lVar6 == 0x30;
  if ((lVar6 != 0x30) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x5e,ERROR,"\"failed: expected \" \"table.size() == 3\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 3",
               (DebugComparison<unsigned_long,_int>_conflict *)&_kjCondition);
  }
  _searchWaldo = (char *)(table.rows.builder.ptr + 1);
  _insertWaldo = (char *)table.rows.builder.ptr;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)insertWaldo,(char (*) [7])0x1c1d05);
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x62,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"foo\\\"\", _kjCondition",
               (char (*) [34])"failed: expected *iter++ == \"foo\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition);
  }
  _insertWaldo = _searchWaldo;
  _searchWaldo = (char *)&(((Exception *)_searchWaldo)->ownFile).content.disposer;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)insertWaldo,(char (*) [7])0x1b5691);
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x63,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"bar\\\"\", _kjCondition",
               (char (*) [34])"failed: expected *iter++ == \"bar\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition);
  }
  _insertWaldo = _searchWaldo;
  _searchWaldo = (char *)&(((Exception *)_searchWaldo)->ownFile).content.disposer;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)insertWaldo,(char (*) [7])0x1c55c2);
  if (Debug::minSeverity < 3 && _kjCondition.result == false) {
    Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x64,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"baz\\\"\", _kjCondition",
               (char (*) [34])"failed: expected *iter++ == \"baz\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition);
  }
  _kjCondition.right = (None *)table.rows.builder.pos;
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = (RemoveConst<kj::StringPtr> *)_searchWaldo == table.rows.builder.pos;
  _kjCondition.left.ptr = &searchWaldo;
  if (((RemoveConst<kj::StringPtr> *)_searchWaldo != table.rows.builder.pos) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr*&,kj::StringPtr*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x65,ERROR,"\"failed: expected \" \"iter == table.end()\", _kjCondition",
               (char (*) [37])"failed: expected iter == table.end()",
               (DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)&_kjCondition);
  }
  table_00.size_ = (size_t)table.rows.builder.ptr;
  table_00.ptr = (StringPtr *)&table.indexes;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher>::find<kj::StringPtr,char_const(&)[4]>
            ((HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)&_kjCondition,table_00,
             (char (*) [7])0x1c1d05);
  if ((char)_kjCondition.left.ptr == '\x01') {
    Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::eraseImpl
              (&table,(size_t)_kjCondition.right);
  }
  else {
    _searchWaldo = (char *)((ulong)_searchWaldo & 0xffffffffffffff00);
    if (Debug::minSeverity < 3) {
      Debug::log<char_const(&)[41],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x68,ERROR,
                 "\"failed: expected \" \"table.eraseMatch(\\\"foo\\\")\", _kjCondition",
                 (char (*) [41])"failed: expected table.eraseMatch(\"foo\")",
                 (DebugExpression<bool> *)searchWaldo);
    }
  }
  _kjCondition.left.ptr =
       (char (*) [7])((long)table.rows.builder.pos - (long)table.rows.builder.ptr >> 4);
  _kjCondition.right = (None *)CONCAT44(_kjCondition.right._4_4_,2);
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  bVar19 = (long)table.rows.builder.pos - (long)table.rows.builder.ptr == 0x20;
  _kjCondition.result = bVar19;
  if ((!bVar19) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x69,ERROR,"\"failed: expected \" \"table.size() == 2\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 2",
               (DebugComparison<unsigned_long,_int>_conflict *)&_kjCondition);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             searchWaldo,(char (*) [7])&table);
  _kjCondition.left.ptr = (char (*) [7])_searchWaldo;
  _kjCondition.right = (None *)&none;
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = (Exception *)_searchWaldo == (Exception *)0x0;
  if (((Exception *)_searchWaldo != (Exception *)0x0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x6a,ERROR,
               "\"failed: expected \" \"table.find(\\\"foo\\\") == kj::none\", _kjCondition",
               (char (*) [47])"failed: expected table.find(\"foo\") == kj::none",&_kjCondition);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             insertWaldo,(char (*) [7])&table);
  if ((Exception *)_insertWaldo == (Exception *)0x0) {
    Debug::Fault::Fault((Fault *)insertWaldo,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,(char  [7])0x6b,FAILED,"table.find(\"bar\") != nullptr","");
    Debug::Fault::fatal((Fault *)insertWaldo);
  }
  _searchWaldo = _insertWaldo;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)searchWaldo,(char (*) [7])0x1b5691);
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x6b,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(table.find(\\\"bar\\\")) == \\\"bar\\\"\", _kjCondition"
               ,(char (*) [63])"failed: expected KJ_ASSERT_NONNULL(table.find(\"bar\")) == \"bar\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             insertWaldo,(char (*) [7])&table);
  if ((Exception *)_insertWaldo == (Exception *)0x0) {
    Debug::Fault::Fault((Fault *)insertWaldo,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,(char  [7])0x6c,FAILED,"table.find(\"baz\") != nullptr","");
    Debug::Fault::fatal((Fault *)insertWaldo);
  }
  _searchWaldo = _insertWaldo;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)searchWaldo,(char (*) [7])0x1c55c2);
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x6c,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(table.find(\\\"baz\\\")) == \\\"baz\\\"\", _kjCondition"
               ,(char (*) [63])"failed: expected KJ_ASSERT_NONNULL(table.find(\"baz\")) == \"baz\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition);
  }
  _searchWaldo = (char *)(table.rows.builder.ptr + 1);
  _insertWaldo = (char *)table.rows.builder.ptr;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)insertWaldo,(char (*) [7])0x1c55c2);
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x70,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"baz\\\"\", _kjCondition",
               (char (*) [34])"failed: expected *iter++ == \"baz\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition);
  }
  _insertWaldo = _searchWaldo;
  _searchWaldo = (char *)&(((Exception *)_searchWaldo)->ownFile).content.disposer;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)insertWaldo,(char (*) [7])0x1b5691);
  if (Debug::minSeverity < 3 && _kjCondition.result == false) {
    Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x71,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"bar\\\"\", _kjCondition",
               (char (*) [34])"failed: expected *iter++ == \"bar\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition);
  }
  _kjCondition.right = (None *)table.rows.builder.pos;
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  bVar19 = (RemoveConst<kj::StringPtr> *)_searchWaldo == table.rows.builder.pos;
  _kjCondition._24_8_ = 5;
  _kjCondition.left.ptr = &searchWaldo;
  _kjCondition.result = bVar19;
  if ((!bVar19) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr*&,kj::StringPtr*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x72,ERROR,"\"failed: expected \" \"iter == table.end()\", _kjCondition",
               (char (*) [37])"failed: expected iter == table.end()",
               (DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)&_kjCondition);
  }
  _searchWaldo = "qux";
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::Impl<0UL,_false>
  ::insert((Impl<0UL,_false> *)&_kjCondition,&table,
           (long)table.rows.builder.pos - (long)table.rows.builder.ptr >> 4,(StringPtr *)searchWaldo
           ,0xffffffff);
  if ((char)_kjCondition.left.ptr == '\x01') {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x77,FAILED,(char *)0x0,"\"shouldn\'t get here\"",
               (char (*) [19])"shouldn\'t get here");
    Debug::Fault::fatal((Fault *)&_kjCondition);
  }
  pNVar5 = (None *)Vector<kj::StringPtr>::add<kj::StringPtr>(&table.rows,(StringPtr *)searchWaldo);
  str<char_const(&)[4]>((String *)searchWaldo,(kj *)"qux",params);
  _insertWaldo = _searchWaldo;
  local_200 = (Exception *)0x4;
  pcVar13 = (char *)0xffffffffffffffff;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::Impl<0UL,_false>
  ::insert((Impl<0UL,_false> *)&_kjCondition,&table,
           (long)table.rows.builder.pos - (long)table.rows.builder.ptr >> 4,(StringPtr *)insertWaldo
           ,0xffffffff);
  if ((char)_kjCondition.left.ptr == '\x01') {
    pNVar10 = (None *)(table.rows.builder.ptr + (long)_kjCondition.right);
    _kjCondition.result = _insertWaldo == _searchWaldo;
    _kjCondition.left.ptr = (char (*) [7])_insertWaldo;
    _kjCondition._16_8_ = anon_var_dwarf_1b07e;
    _kjCondition._24_8_ = 5;
    if (Debug::minSeverity < 3 && !_kjCondition.result) {
      pcVar13 = "failed: expected param.begin() == copy.begin()";
      _kjCondition.right = (None *)(Exception *)_searchWaldo;
      Debug::log<char_const(&)[47],kj::_::DebugComparison<char_const*,char*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x7c,ERROR,
                 "\"failed: expected \" \"param.begin() == copy.begin()\", _kjCondition",
                 (char (*) [47])"failed: expected param.begin() == copy.begin()",
                 (DebugComparison<const_char_*,_char_*> *)&_kjCondition);
    }
    _kjCondition._16_8_ = anon_var_dwarf_1b07e;
    _kjCondition._24_8_ = 5;
    _kjCondition.result = pNVar5 == pNVar10;
    _kjCondition.left.ptr = (char (*) [7])pNVar10;
    _kjCondition.right = pNVar5;
    if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
      pcVar13 = "failed: expected &existing == &row";
      Debug::log<char_const(&)[35],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x7d,ERROR,"\"failed: expected \" \"&existing == &row\", _kjCondition",
                 (char (*) [35])"failed: expected &existing == &row",
                 (DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)&_kjCondition);
    }
  }
  else {
    Vector<kj::StringPtr>::add<kj::StringPtr>(&table.rows,(StringPtr *)insertWaldo);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             &_kjCondition,(char (*) [7])&table);
  if (_kjCondition.left.ptr == (char (*) [7])0x0) {
    Debug::Fault::Fault((Fault *)&_kjCondition,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,(char  [7])0x80,FAILED,"table.find(\"qux\") != nullptr","");
    Debug::Fault::fatal((Fault *)&_kjCondition);
  }
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = (None *)_kjCondition.left.ptr == pNVar5;
  _kjCondition.right = pNVar5;
  if (((None *)_kjCondition.left.ptr != pNVar5) && (Debug::minSeverity < 3)) {
    pcVar13 = "failed: expected &found == &row";
    Debug::log<char_const(&)[32],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x81,ERROR,"\"failed: expected \" \"&found == &row\", _kjCondition",
               (char (*) [32])"failed: expected &found == &row",
               (DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)&_kjCondition);
  }
  Array<char>::~Array((Array<char> *)searchWaldo);
  STRS[2].content.ptr = "garply";
  STRS[2].content.size_ = 7;
  STRS[1].content.ptr = "grault";
  STRS[1].content.size_ = 7;
  STRS[0].content.ptr = "corge";
  STRS[0].content.size_ = 6;
  sVar18 = ((long)table.rows.builder.pos - (long)table.rows.builder.ptr >> 4) + 3;
  Vector<kj::StringPtr>::reserve(&table.rows,sVar18);
  if (table.indexes.buckets.size_ < sVar18 * 2) {
    HashIndex<kj::_::(anonymous_namespace)::StringHasher>::rehash(&table.indexes,sVar18);
  }
  for (lVar6 = 0; lVar6 != 0x30; lVar6 = lVar6 + 0x10) {
    Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::insert
              (&table,(StringPtr *)((long)&STRS[0].content.ptr + lVar6));
  }
  _kjCondition.left.ptr =
       (char (*) [7])((long)table.rows.builder.pos - (long)table.rows.builder.ptr >> 4);
  _kjCondition.right = (None *)CONCAT44(_kjCondition.right._4_4_,6);
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  bVar19 = (long)table.rows.builder.pos - (long)table.rows.builder.ptr == 0x60;
  _kjCondition.result = bVar19;
  if ((!bVar19) && (Debug::minSeverity < 3)) {
    pcVar13 = "failed: expected table.size() == 6";
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x86,ERROR,"\"failed: expected \" \"table.size() == 6\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 6",
               (DebugComparison<unsigned_long,_int>_conflict *)&_kjCondition);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[6]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             searchWaldo,(char (*) [7])&table);
  _kjCondition.left.ptr = (char (*) [7])_searchWaldo;
  _kjCondition.right = (None *)&none;
  _kjCondition._16_8_ = anon_var_dwarf_1c14d;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = (Exception *)_searchWaldo != (Exception *)0x0;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    pcVar13 = "failed: expected table.find(\"corge\") != kj::none";
    Debug::log<char_const(&)[49],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x87,ERROR,
               "\"failed: expected \" \"table.find(\\\"corge\\\") != kj::none\", _kjCondition",
               (char (*) [49])"failed: expected table.find(\"corge\") != kj::none",&_kjCondition);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[7]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             searchWaldo,(char (*) [7])&table);
  _kjCondition.left.ptr = (char (*) [7])_searchWaldo;
  _kjCondition.right = (None *)&none;
  _kjCondition._16_8_ = anon_var_dwarf_1c14d;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = (Exception *)_searchWaldo != (Exception *)0x0;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    pcVar13 = "failed: expected table.find(\"grault\") != kj::none";
    Debug::log<char_const(&)[50],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x88,ERROR,
               "\"failed: expected \" \"table.find(\\\"grault\\\") != kj::none\", _kjCondition",
               (char (*) [50])"failed: expected table.find(\"grault\") != kj::none",&_kjCondition);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[7]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             searchWaldo,(char (*) [7])&table);
  _kjCondition.left.ptr = (char (*) [7])_searchWaldo;
  _kjCondition.right = (None *)&none;
  _kjCondition._16_8_ = anon_var_dwarf_1c14d;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = (Exception *)_searchWaldo != (Exception *)0x0;
  if (((Exception *)_searchWaldo == (Exception *)0x0) && (Debug::minSeverity < 3)) {
    pcVar13 = "failed: expected table.find(\"garply\") != kj::none";
    Debug::log<char_const(&)[50],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x89,ERROR,
               "\"failed: expected \" \"table.find(\\\"garply\\\") != kj::none\", _kjCondition",
               (char (*) [50])"failed: expected table.find(\"garply\") != kj::none",&_kjCondition);
  }
  local_40.content.ptr = "bar";
  local_40.content.size_ = 4;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::insert
            (&table,&local_40);
  _searchWaldo = (char *)((ulong)_searchWaldo & 0xffffffffffffff00);
  NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition,
             (NullableValue<kj::Exception> *)searchWaldo);
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)searchWaldo);
  if ((char)_kjCondition.left.ptr == '\x01') {
    if (local_520 == 0) {
      local_528 = "";
    }
    _insertWaldo = "inserted row already exists in table";
    local_200 = (Exception *)0x25;
    _searchWaldo = (char *)local_528;
    bVar19 = StringPtr::contains((StringPtr *)searchWaldo,(StringPtr *)insertWaldo);
    _kjCondition_31.value = bVar19;
    if (Debug::minSeverity < 3 && !bVar19) {
      pcVar13 = 
      "failed: expected e.getDescription().contains(\"inserted row already exists in table\")";
      Debug::log<char_const(&)[85],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x8b,ERROR,
                 "\"failed: expected \" \"e.getDescription().contains(\\\"inserted row already exists in table\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                 ,(char (*) [85])
                  "failed: expected e.getDescription().contains(\"inserted row already exists in table\")"
                 ,&_kjCondition_31,
                 (char (*) [56])"exception description didn\'t contain expected substring",
                 (Exception_conflict *)&_kjCondition.right);
    }
  }
  else if (Debug::minSeverity < 3) {
    pcVar13 = "code did not throw: table.insert(\"bar\")";
    Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x8b,ERROR,"\"code did not throw: \" \"table.insert(\\\"bar\\\")\"",
               (char (*) [40])"code did not throw: table.insert(\"bar\")");
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition);
  lVar6 = (long)table.rows.builder.pos - (long)table.rows.builder.ptr;
  _kjCondition.left.ptr = (char (*) [7])(lVar6 >> 4);
  _kjCondition.right = (None *)CONCAT44(_kjCondition.right._4_4_,6);
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = lVar6 == 0x60;
  if ((lVar6 != 0x60) && (Debug::minSeverity < 3)) {
    pcVar13 = "failed: expected table.size() == 6";
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x8d,ERROR,"\"failed: expected \" \"table.size() == 6\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 6",
               (DebugComparison<unsigned_long,_int>_conflict *)&_kjCondition);
  }
  _searchWaldo = "baa";
  aStack_398.value.ownFile.content.ptr = (char *)0x4;
  _insertWaldo = (char *)Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                         ::insert(&table,(StringPtr *)searchWaldo);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)insertWaldo,(char (*) [7])"baa");
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    pcVar13 = "failed: expected table.insert(\"baa\") == \"baa\"";
    Debug::log<char_const(&)[46],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x8f,ERROR,
               "\"failed: expected \" \"table.insert(\\\"baa\\\") == \\\"baa\\\"\", _kjCondition",
               (char (*) [46])"failed: expected table.insert(\"baa\") == \"baa\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition);
  }
  pos_00 = (char *)0x0;
  pcVar11 = (char *)0x0;
  while( true ) {
    lVar6 = (long)table.rows.builder.pos - (long)table.rows.builder.ptr;
    pacVar7 = (char (*) [7])(lVar6 >> 4);
    if (pacVar7 <= pos_00) break;
    _searchWaldo = table.rows.builder.ptr[(long)pos_00].content.ptr;
    aStack_398.value.ownFile.content.ptr =
         (char *)table.rows.builder.ptr[(long)pos_00].content.size_;
    _insertWaldo = "ba";
    local_200 = (Exception *)0x3;
    bVar19 = StringPtr::startsWith((StringPtr *)searchWaldo,(StringPtr *)insertWaldo);
    if (bVar19) {
      Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::eraseImpl
                (&table,(size_t)pos_00);
      pcVar11 = pcVar11 + 1;
    }
    else {
      pos_00 = pos_00 + 1;
    }
  }
  bVar19 = (char (*) [7])pcVar11 == (char (*) [7])0x3;
  _kjCondition.right = (None *)CONCAT44(_kjCondition.right._4_4_,3);
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  pcVar13 = (char *)CONCAT71((int7)((ulong)pcVar13 >> 8),2 < Debug::minSeverity || bVar19);
  if (2 >= Debug::minSeverity && !bVar19) {
    pcVar13 = 
    "failed: expected table.eraseAll([](StringPtr s) { return s.startsWith(\"ba\"); }) == 3";
    _kjCondition.left.ptr = (char (*) [7])pcVar11;
    _kjCondition.result = bVar19;
    Debug::log<char_const(&)[85],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x91,ERROR,
               "\"failed: expected \" \"table.eraseAll([](StringPtr s) { return s.startsWith(\\\"ba\\\"); }) == 3\", _kjCondition"
               ,(char (*) [85])
                "failed: expected table.eraseAll([](StringPtr s) { return s.startsWith(\"ba\"); }) == 3"
               ,(DebugComparison<unsigned_long,_int>_conflict *)&_kjCondition);
    lVar6 = (long)table.rows.builder.pos - (long)table.rows.builder.ptr;
    pacVar7 = (char (*) [7])(lVar6 >> 4);
  }
  _kjCondition.right = (None *)CONCAT44(_kjCondition.right._4_4_,4);
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = lVar6 == 0x40;
  _kjCondition.left.ptr = pacVar7;
  if ((lVar6 != 0x40) && (Debug::minSeverity < 3)) {
    pcVar13 = "failed: expected table.size() == 4";
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x92,ERROR,"\"failed: expected \" \"table.size() == 4\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 4",
               (DebugComparison<unsigned_long,_int>_conflict *)&_kjCondition);
  }
  _searchWaldo = (char *)(table.rows.builder.ptr + 1);
  _insertWaldo = (char *)table.rows.builder.ptr;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)insertWaldo,(char (*) [7])"garply");
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    pcVar13 = "failed: expected *iter++ == \"garply\"";
    Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x96,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"garply\\\"\", _kjCondition",
               (char (*) [37])"failed: expected *iter++ == \"garply\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)&_kjCondition);
  }
  _insertWaldo = _searchWaldo;
  _searchWaldo = (char *)&(((Exception *)_searchWaldo)->ownFile).content.disposer;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)insertWaldo,(char (*) [7])"grault");
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    pcVar13 = "failed: expected *iter++ == \"grault\"";
    Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x97,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"grault\\\"\", _kjCondition",
               (char (*) [37])"failed: expected *iter++ == \"grault\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)&_kjCondition);
  }
  _insertWaldo = _searchWaldo;
  _searchWaldo = (char *)&(((Exception *)_searchWaldo)->ownFile).content.disposer;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)insertWaldo,(char (*) [7])"qux");
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    pcVar13 = "failed: expected *iter++ == \"qux\"";
    Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x98,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"qux\\\"\", _kjCondition",
               (char (*) [34])"failed: expected *iter++ == \"qux\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition);
  }
  _insertWaldo = _searchWaldo;
  _searchWaldo = (char *)&(((Exception *)_searchWaldo)->ownFile).content.disposer;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr&> *)insertWaldo,(char (*) [7])"corge");
  sVar18 = extraout_RDX;
  if (Debug::minSeverity < 3 && _kjCondition.result == false) {
    pcVar13 = "failed: expected *iter++ == \"corge\"";
    Debug::log<char_const(&)[36],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[6]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x99,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"corge\\\"\", _kjCondition",
               (char (*) [36])"failed: expected *iter++ == \"corge\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)&_kjCondition);
    sVar18 = extraout_RDX_00;
  }
  _kjCondition.left.ptr = &searchWaldo;
  _kjCondition.right = (None *)table.rows.builder.pos;
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = (RemoveConst<kj::StringPtr> *)_searchWaldo == table.rows.builder.pos;
  if (((RemoveConst<kj::StringPtr> *)_searchWaldo != table.rows.builder.pos) &&
     (Debug::minSeverity < 3)) {
    pcVar13 = "failed: expected iter == table.end()";
    Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr*&,kj::StringPtr*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x9a,ERROR,"\"failed: expected \" \"iter == table.end()\", _kjCondition",
               (char (*) [37])"failed: expected iter == table.end()",
               (DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)&_kjCondition);
    sVar18 = extraout_RDX_01;
  }
  pSVar2 = table.rows.builder.ptr;
  pNVar5 = (None *)table.rows.builder.ptr[1].content.ptr;
  lVar6 = (long)table.rows.builder.pos - (long)table.rows.builder.ptr;
  lVar16 = lVar6 >> 4;
  if (table.indexes.buckets.size_ * 2 < (table.indexes.erasedCount + lVar16) * 3 + 3) {
    HashIndex<kj::_::(anonymous_namespace)::StringHasher>::rehash(&table.indexes,lVar16 * 3 + 3);
    sVar18 = extraout_RDX_02;
  }
  str.content.size_ = sVar18;
  str.content.ptr = (char *)0x7;
  uVar3 = StringHasher::hashCode((StringHasher *)"grault",str);
  pEVar4 = (Exception *)(pSVar2 + 1);
  uVar14 = (int)table.indexes.buckets.size_ - 1U & uVar3;
  pHVar12 = (HashBucket *)0x0;
  sVar18 = table.indexes.buckets.size_;
LAB_0014d446:
  pHVar17 = table.indexes.buckets.ptr + uVar14;
  uVar1 = pHVar17->value;
  if (uVar1 == 1) {
    if (pHVar12 == (HashBucket *)0x0) {
      pHVar12 = pHVar17;
    }
  }
  else {
    if (uVar1 == 0) {
      if (pHVar12 != (HashBucket *)0x0) {
        table.indexes.erasedCount = table.indexes.erasedCount - 1;
        pHVar17 = pHVar12;
      }
      *pHVar17 = (HashBucket)((ulong)uVar3 + lVar6 * 0x10000000 + 0x200000000);
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27]>
                ((Fault *)searchWaldo,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xa1,FAILED,(char *)0x0,"\"shouldn\'t have called this\"",
                 (char (*) [27])"shouldn\'t have called this");
      Debug::Fault::fatal((Fault *)searchWaldo);
    }
    if ((pHVar17->hash == uVar3) &&
       (a.content.size_ = (size_t)"grault", a.content.ptr = (char *)pSVar2[uVar1 - 2].content.size_,
       b.content.size_ = (size_t)pcVar13, b.content.ptr = (char *)0x7,
       bVar19 = StringHasher::matches((StringHasher *)pSVar2[uVar1 - 2].content.ptr,a,b),
       sVar18 = table.indexes.buckets.size_, bVar19)) goto LAB_0014d4af;
  }
  sVar15 = (ulong)uVar14 + 1;
  uVar14 = (uint)sVar15;
  if (sVar15 == sVar18) {
    uVar14 = 0;
  }
  goto LAB_0014d446;
LAB_0014d4af:
  _kjCondition.left.ptr = (char (*) [7])(table.rows.builder.ptr + (pHVar17->value - 2));
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  if (Debug::minSeverity < 3 && (Exception *)_kjCondition.left.ptr != pEVar4) {
    pcVar13 = 
    "failed: expected &table.findOrCreate(\"grault\", [&]() -> kj::StringPtr { KJ_FAIL_ASSERT(\"shouldn\'t have called this\"); }) == &graultRow"
    ;
    _kjCondition.right = (None *)pEVar4;
    _kjCondition.result = (Exception *)_kjCondition.left.ptr == pEVar4;
    Debug::log<char_const(&)[135],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0xa1,ERROR,
               "\"failed: expected \" \"&table.findOrCreate(\\\"grault\\\", [&]() -> kj::StringPtr { KJ_FAIL_ASSERT(\\\"shouldn\'t have called this\\\"); }) == &graultRow\", _kjCondition"
               ,(char (*) [135])
                "failed: expected &table.findOrCreate(\"grault\", [&]() -> kj::StringPtr { KJ_FAIL_ASSERT(\"shouldn\'t have called this\"); }) == &graultRow"
               ,(DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)&_kjCondition);
  }
  _kjCondition.left.ptr = (char (*) [7])(pEVar4->ownFile).content.ptr;
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = (None *)_kjCondition.left.ptr == pNVar5;
  _kjCondition.right = pNVar5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    pcVar13 = "failed: expected graultRow.begin() == origGrault.begin()";
    Debug::log<char_const(&)[57],kj::_::DebugComparison<char_const*,char_const*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0xa2,ERROR,
               "\"failed: expected \" \"graultRow.begin() == origGrault.begin()\", _kjCondition",
               (char (*) [57])"failed: expected graultRow.begin() == origGrault.begin()",
               (DebugComparison<const_char_*,_const_char_*> *)&_kjCondition);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[7]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             searchWaldo,(char (*) [7])&table);
  if ((Exception *)_searchWaldo == (Exception *)0x0) {
    Debug::Fault::Fault((Fault *)searchWaldo,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,(char  [7])0xa3,FAILED,"table.find(\"grault\") != nullptr","");
    Debug::Fault::fatal((Fault *)searchWaldo);
  }
  _kjCondition.left.ptr = (char (*) [7])_searchWaldo;
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = (Exception *)_searchWaldo == pEVar4;
  _kjCondition.right = (None *)pEVar4;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    pcVar13 = "failed: expected &KJ_ASSERT_NONNULL(table.find(\"grault\")) == &graultRow";
    Debug::log<char_const(&)[72],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0xa3,ERROR,
               "\"failed: expected \" \"&KJ_ASSERT_NONNULL(table.find(\\\"grault\\\")) == &graultRow\", _kjCondition"
               ,(char (*) [72])
                "failed: expected &KJ_ASSERT_NONNULL(table.find(\"grault\")) == &graultRow",
               (DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)&_kjCondition);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[6]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             searchWaldo,(char (*) [7])&table);
  _kjCondition.result = (Exception *)_searchWaldo == (Exception *)0x0;
  _kjCondition.left.ptr = (char (*) [7])_searchWaldo;
  _kjCondition.right = (None *)&none;
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  if (Debug::minSeverity < 3 && !_kjCondition.result) {
    pcVar13 = "failed: expected table.find(\"waldo\") == kj::none";
    Debug::log<char_const(&)[49],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0xa4,ERROR,
               "\"failed: expected \" \"table.find(\\\"waldo\\\") == kj::none\", _kjCondition",
               (char (*) [49])"failed: expected table.find(\"waldo\") == kj::none",&_kjCondition);
  }
  lVar6 = (long)table.rows.builder.pos - (long)table.rows.builder.ptr;
  pacVar7 = (char (*) [7])(lVar6 >> 4);
  _kjCondition.right = (None *)CONCAT44(_kjCondition.right._4_4_,4);
  _kjCondition._16_8_ = anon_var_dwarf_1b07e;
  _kjCondition._24_8_ = 5;
  _kjCondition.result = lVar6 == 0x40;
  _kjCondition.left.ptr = pacVar7;
  if ((lVar6 != 0x40) && (Debug::minSeverity < 3)) {
    pcVar13 = "failed: expected table.size() == 4";
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0xa5,ERROR,"\"failed: expected \" \"table.size() == 4\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 4",
               (DebugComparison<unsigned_long,_int>_conflict *)&_kjCondition);
    pacVar7 = extraout_RDX_03;
  }
  str<char_const(&)[6]>((String *)searchWaldo,(kj *)0x1b9314,(char (*) [6])pacVar7);
  str<char_const(&)[6]>((String *)insertWaldo,(kj *)0x1b9314,params_00);
  pSVar2 = table.rows.builder.ptr;
  lVar6 = (long)table.rows.builder.pos - (long)table.rows.builder.ptr;
  pos = lVar6 >> 4;
  uVar8 = (table.indexes.erasedCount + pos) * 3 + 3;
  if (table.indexes.buckets.size_ * 2 < uVar8) {
    HashIndex<kj::_::(anonymous_namespace)::StringHasher>::rehash(&table.indexes,pos * 3 + 3);
    uVar8 = extraout_RDX_04;
  }
  FVar9.exception = (Exception *)_searchWaldo;
  if (aStack_398.value.ownFile.content.ptr == (char *)0x0) {
    FVar9.exception = (Exception *)0x1cf111;
  }
  str_00.content.ptr =
       aStack_398.value.ownFile.content.ptr + (aStack_398.value.ownFile.content.ptr == (char *)0x0);
  str_00.content.size_ = uVar8;
  uVar3 = StringHasher::hashCode((StringHasher *)FVar9.exception,str_00);
  uVar14 = (int)table.indexes.buckets.size_ - 1U & uVar3;
  pHVar12 = (HashBucket *)0x0;
  sVar18 = table.indexes.buckets.size_;
  do {
    pHVar17 = table.indexes.buckets.ptr + uVar14;
    uVar1 = pHVar17->value;
    if (uVar1 == 1) {
      if (pHVar12 == (HashBucket *)0x0) {
        pHVar12 = pHVar17;
      }
    }
    else {
      if (uVar1 == 0) {
        if (pHVar12 != (HashBucket *)0x0) {
          table.indexes.erasedCount = table.indexes.erasedCount - 1;
          pHVar17 = pHVar12;
        }
        *pHVar17 = (HashBucket)((ulong)uVar3 + lVar6 * 0x10000000 + 0x200000000);
        _kjCondition.right = (None *)&success;
        success = false;
        _kjCondition.left.ptr._0_1_ = 1;
        _kjCondition._16_8_ = &table;
        _kjCondition._24_8_ = &pos;
        _kjCondition._32_8_ = searchWaldo;
        __kjCondition_31 = (Exception *)_insertWaldo;
        if (local_200 == (Exception *)0x0) {
          __kjCondition_31 = (Exception *)0x1cf111;
        }
        pEVar4 = (Exception *)
                 Vector<kj::StringPtr>::add<kj::StringPtr>
                           ((Vector<kj::StringPtr> *)_kjCondition._16_8_,
                            (StringPtr *)&_kjCondition_31);
        success = true;
        Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:615:7)>
        ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:615:7)>
                     *)&_kjCondition);
        goto LAB_0014d958;
      }
      if (pHVar17->hash == uVar3) {
        FVar9.exception = (Exception *)0x1cf111;
        if (aStack_398.value.ownFile.content.ptr != (char *)0x0) {
          FVar9.exception = (Exception *)_searchWaldo;
        }
        b_00.content.ptr =
             aStack_398.value.ownFile.content.ptr +
             (aStack_398.value.ownFile.content.ptr == (char *)0x0);
        a_00.content.size_ = (size_t)FVar9.exception;
        a_00.content.ptr = (char *)pSVar2[uVar1 - 2].content.size_;
        b_00.content.size_ = (size_t)pcVar13;
        bVar19 = StringHasher::matches((StringHasher *)pSVar2[uVar1 - 2].content.ptr,a_00,b_00);
        sVar18 = table.indexes.buckets.size_;
        if (bVar19) {
          pEVar4 = (Exception *)(table.rows.builder.ptr + (pHVar17->value - 2));
LAB_0014d958:
          __kjCondition_31 = pEVar4;
          DebugExpression<kj::StringPtr&>::operator==
                    ((DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)&_kjCondition,
                     (DebugExpression<kj::StringPtr&> *)&_kjCondition_31,(char (*) [7])0x1b9314);
          if (Debug::minSeverity < 3 && _kjCondition.result == false) {
            Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[6]>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xac,ERROR,
                       "\"failed: expected \" \"waldo == \\\"waldo\\\"\", _kjCondition",
                       (char (*) [34])"failed: expected waldo == \"waldo\"",
                       (DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)&_kjCondition);
          }
          _kjCondition.left.ptr = (char (*) [7])(pEVar4->ownFile).content.ptr;
          if (local_200 != (Exception *)0x0) {
            local_200 = (Exception *)_insertWaldo;
          }
          _kjCondition._16_8_ = anon_var_dwarf_1b07e;
          _kjCondition._24_8_ = 5;
          _kjCondition.result = (Exception *)_kjCondition.left.ptr == local_200;
          _kjCondition.right = (None *)local_200;
          if (((Exception *)_kjCondition.left.ptr != local_200) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[54],kj::_::DebugComparison<char_const*,char*>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xad,ERROR,
                       "\"failed: expected \" \"waldo.begin() == insertWaldo.begin()\", _kjCondition"
                       ,(char (*) [54])"failed: expected waldo.begin() == insertWaldo.begin()",
                       (DebugComparison<const_char_*,_char_*> *)&_kjCondition);
          }
          Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
          find<0ul,char_const(&)[7]>
                    ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                      *)&pos,(char (*) [7])&table);
          if (pos == 0) {
            Debug::Fault::Fault((Fault *)&pos,
                                "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                                ,(char  [7])0xae,FAILED,"table.find(\"grault\") != nullptr","");
            Debug::Fault::fatal((Fault *)&pos);
          }
          __kjCondition_31 = (Exception *)pos;
          DebugExpression<kj::StringPtr&>::operator==
                    ((DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)&_kjCondition,
                     (DebugExpression<kj::StringPtr&> *)&_kjCondition_31,(char (*) [7])"grault");
          if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[69],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xae,ERROR,
                       "\"failed: expected \" \"KJ_ASSERT_NONNULL(table.find(\\\"grault\\\")) == \\\"grault\\\"\", _kjCondition"
                       ,(char (*) [69])
                        "failed: expected KJ_ASSERT_NONNULL(table.find(\"grault\")) == \"grault\"",
                       (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)&_kjCondition);
          }
          Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
          find<0ul,char_const(&)[6]>
                    ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                      *)&_kjCondition_31,(char (*) [7])&table);
          if (__kjCondition_31 == (Exception *)0x0) {
            Debug::Fault::Fault((Fault *)&_kjCondition_31,
                                "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                                ,(char  [7])0xaf,FAILED,"table.find(\"waldo\") != nullptr","");
            Debug::Fault::fatal((Fault *)&_kjCondition_31);
          }
          _kjCondition.left.ptr = (char (*) [7])__kjCondition_31;
          _kjCondition._16_8_ = anon_var_dwarf_1b07e;
          _kjCondition._24_8_ = 5;
          _kjCondition.right = (None *)pEVar4;
          if (Debug::minSeverity < 3 && __kjCondition_31 != pEVar4) {
            _kjCondition.result = __kjCondition_31 == pEVar4;
            Debug::log<char_const(&)[67],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xaf,ERROR,
                       "\"failed: expected \" \"&KJ_ASSERT_NONNULL(table.find(\\\"waldo\\\")) == &waldo\", _kjCondition"
                       ,(char (*) [67])
                        "failed: expected &KJ_ASSERT_NONNULL(table.find(\"waldo\")) == &waldo",
                       (DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)&_kjCondition);
          }
          lVar6 = (long)table.rows.builder.pos - (long)table.rows.builder.ptr;
          _kjCondition.left.ptr = (char (*) [7])(lVar6 >> 4);
          _kjCondition.right = (None *)CONCAT44(_kjCondition.right._4_4_,5);
          _kjCondition._16_8_ = anon_var_dwarf_1b07e;
          _kjCondition._24_8_ = 5;
          _kjCondition.result = lVar6 == 0x50;
          if ((lVar6 != 0x50) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xb0,ERROR,
                       "\"failed: expected \" \"table.size() == 5\", _kjCondition",
                       (char (*) [35])"failed: expected table.size() == 5",
                       (DebugComparison<unsigned_long,_int>_conflict *)&_kjCondition);
          }
          pSVar2 = table.rows.builder.ptr;
          pEVar4 = (Exception *)(table.rows.builder.ptr + 1);
          pos = (size_t)table.rows.builder.ptr;
          __kjCondition_31 = pEVar4;
          DebugExpression<kj::StringPtr&>::operator==
                    ((DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)&_kjCondition,
                     (DebugExpression<kj::StringPtr&> *)&pos,(char (*) [7])"garply");
          if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xb4,ERROR,
                       "\"failed: expected \" \"*iter++ == \\\"garply\\\"\", _kjCondition",
                       (char (*) [37])"failed: expected *iter++ == \"garply\"",
                       (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)&_kjCondition);
          }
          pos = (size_t)pEVar4;
          DebugExpression<kj::StringPtr&>::operator==
                    ((DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)&_kjCondition,
                     (DebugExpression<kj::StringPtr&> *)&pos,(char (*) [7])"grault");
          if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xb5,ERROR,
                       "\"failed: expected \" \"*iter++ == \\\"grault\\\"\", _kjCondition",
                       (char (*) [37])"failed: expected *iter++ == \"grault\"",
                       (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)&_kjCondition);
          }
          pos = (size_t)(pSVar2 + 2);
          __kjCondition_31 = (Exception *)(pSVar2 + 3);
          DebugExpression<kj::StringPtr&>::operator==
                    ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition,
                     (DebugExpression<kj::StringPtr&> *)&pos,(char (*) [7])"qux");
          if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xb6,ERROR,
                       "\"failed: expected \" \"*iter++ == \\\"qux\\\"\", _kjCondition",
                       (char (*) [34])"failed: expected *iter++ == \"qux\"",
                       (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)&_kjCondition);
          }
          pos = (size_t)(pSVar2 + 3);
          DebugExpression<kj::StringPtr&>::operator==
                    ((DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)&_kjCondition,
                     (DebugExpression<kj::StringPtr&> *)&pos,(char (*) [7])"corge");
          if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[36],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[6]>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xb7,ERROR,
                       "\"failed: expected \" \"*iter++ == \\\"corge\\\"\", _kjCondition",
                       (char (*) [36])"failed: expected *iter++ == \"corge\"",
                       (DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)&_kjCondition);
          }
          pos = (size_t)(pSVar2 + 4);
          pEVar4 = (Exception *)(pSVar2 + 5);
          __kjCondition_31 = pEVar4;
          DebugExpression<kj::StringPtr&>::operator==
                    ((DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)&_kjCondition,
                     (DebugExpression<kj::StringPtr&> *)&pos,(char (*) [7])0x1b9314);
          if (Debug::minSeverity < 3 && _kjCondition.result == false) {
            Debug::log<char_const(&)[36],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[6]>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xb8,ERROR,
                       "\"failed: expected \" \"*iter++ == \\\"waldo\\\"\", _kjCondition",
                       (char (*) [36])"failed: expected *iter++ == \"waldo\"",
                       (DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)&_kjCondition);
          }
          _kjCondition.right = (None *)table.rows.builder.pos;
          _kjCondition._16_8_ = anon_var_dwarf_1b07e;
          _kjCondition._24_8_ = 5;
          _kjCondition.result = pEVar4 == (Exception *)table.rows.builder.pos;
          _kjCondition.left.ptr = (char (*) [7])&_kjCondition_31;
          if ((pEVar4 != (Exception *)table.rows.builder.pos) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr*&,kj::StringPtr*>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xb9,ERROR,
                       "\"failed: expected \" \"iter == table.end()\", _kjCondition",
                       (char (*) [37])"failed: expected iter == table.end()",
                       (DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)&_kjCondition);
          }
          Array<char>::~Array((Array<char> *)insertWaldo);
          Array<char>::~Array((Array<char> *)searchWaldo);
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::~Table
                    (&table);
          return;
        }
      }
    }
    sVar15 = (ulong)uVar14 + 1;
    uVar14 = (uint)sVar15;
    if (sVar15 == sVar18) {
      uVar14 = 0;
    }
  } while( true );
}

Assistant:

TEST(String, StartsEndsWith) {
  EXPECT_TRUE("foobar"_kj.startsWith("foo"));
  EXPECT_FALSE("foobar"_kj.startsWith("bar"));
  EXPECT_FALSE("foobar"_kj.endsWith("foo"));
  EXPECT_TRUE("foobar"_kj.endsWith("bar"));

  EXPECT_FALSE("fo"_kj.startsWith("foo"));
  EXPECT_FALSE("fo"_kj.endsWith("foo"));

  EXPECT_TRUE("foobar"_kj.startsWith(""));
  EXPECT_TRUE("foobar"_kj.endsWith(""));
}